

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

string * __thiscall
sznet::net::Channel::eventsToString_abi_cxx11_
          (string *__return_storage_ptr__,Channel *this,sz_sock fd,int ev)

{
  ostream *poVar1;
  ostringstream local_1a0 [8];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,(int)this);
  std::operator<<(poVar1,": ");
  if ((fd & 1U) != 0) {
    std::operator<<((ostream *)local_1a0,"IN ");
  }
  if ((fd & 2U) != 0) {
    std::operator<<((ostream *)local_1a0,"PRI ");
  }
  if ((fd & 4U) != 0) {
    std::operator<<((ostream *)local_1a0,"RDHUP ");
  }
  if ((fd & 8U) != 0) {
    std::operator<<((ostream *)local_1a0,"OUT ");
  }
  if ((fd & 0x10U) != 0) {
    std::operator<<((ostream *)local_1a0,"ERROR ");
  }
  if ((fd & 0x20U) != 0) {
    std::operator<<((ostream *)local_1a0,"HUP ");
  }
  if ((fd & 0x40U) != 0) {
    std::operator<<((ostream *)local_1a0,"NVAL ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string Channel::eventsToString(sockets::sz_sock fd, int ev)
{
	std::ostringstream oss;
	oss << fd << ": ";
	if (ev & kReadEvent)
	{
		oss << "IN ";
	}
	if (ev & kPriEvent)
	{
		oss << "PRI ";
	}
	if (ev & kRdHupEvent)
	{
		oss << "RDHUP ";
	}
	if (ev & kWriteEvent)
	{
		oss << "OUT ";
	}
	if (ev & kErrorEvent)
	{
		oss << "ERROR ";
	}
	if (ev & kHupEvent)
	{
		oss << "HUP ";
	}
	if (ev & kNvalEvent)
	{
		oss << "NVAL ";
	}
	return oss.str();
}